

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  stat buf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (flags == 0) {
    memset(&buf,0xaa,0x90);
    iVar2 = (*aSyscall[4].pCurrent)(zPath,&buf);
    uVar3 = 0;
    if (iVar2 == 0) {
      uVar3 = (uint)(0 < buf.st_size || (buf.st_mode & 0xf000) != 0x8000);
    }
  }
  else {
    iVar2 = (*aSyscall[2].pCurrent)(zPath,6);
    uVar3 = (uint)(iVar2 == 0);
  }
  *pResOut = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  assert( pResOut!=0 );

  /* The spec says there are three possible values for flags.  But only
  ** two of them are actually used */
  assert( flags==SQLITE_ACCESS_EXISTS || flags==SQLITE_ACCESS_READWRITE );

  if( flags==SQLITE_ACCESS_EXISTS ){
    struct stat buf;
    *pResOut = 0==osStat(zPath, &buf) &&
                (!S_ISREG(buf.st_mode) || buf.st_size>0);
  }else{
    *pResOut = osAccess(zPath, W_OK|R_OK)==0;
  }
  return SQLITE_OK;
}